

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddAPI.c
# Opt level: O0

long Cudd_ReadPeakNodeCount(DdManager *dd)

{
  DdNode *local_20;
  DdNodePtr *scan;
  long count;
  DdManager *dd_local;
  
  scan = (DdNodePtr *)0x0;
  for (local_20 = (DdNode *)dd->memoryList; local_20 != (DdNode *)0x0;
      local_20 = *(DdNode **)local_20) {
    scan = (DdNodePtr *)((long)scan + 0x3fe);
  }
  return (long)scan;
}

Assistant:

long
Cudd_ReadPeakNodeCount(
  DdManager * dd)
{
    long count = 0;
    DdNodePtr *scan = dd->memoryList;

    while (scan != NULL) {
        count += DD_MEM_CHUNK;
        scan = (DdNodePtr *) *scan;
    }
    return(count);

}